

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0,false>
               (double *begin,double *end,int param_3,byte param_4)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  double dVar4;
  double dVar5;
  undefined4 uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  ulong uVar14;
  double *pdVar15;
  double *pdVar16;
  ulong uVar17;
  double *pdVar18;
  double *pdVar19;
  double *pdVar20;
  long lVar21;
  double *pdVar22;
  double *pdVar23;
  ulong uVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  _DistanceType __len;
  ulong uVar28;
  bool bVar29;
  undefined4 uVar30;
  double __tmp_1;
  undefined4 uVar31;
  double __tmp;
  double __tmp_15;
  double dVar32;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  int local_68;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar28 = (long)end - (long)begin;
  if ((long)uVar28 < 0x240) {
    if (param_4 == 0) {
LAB_002d7d19:
      if (begin + 3 == end || begin == end) {
        return;
      }
      pdVar15 = begin + 4;
      pdVar20 = begin + 3;
      do {
        pdVar19 = pdVar20;
        dVar4 = begin[3];
        if (*begin <= dVar4 && dVar4 != *begin) {
          dVar5 = begin[4];
          dVar7 = begin[5];
          uVar30 = SUB84(*begin,0);
          uVar31 = (undefined4)((ulong)*begin >> 0x20);
          pdVar20 = pdVar15;
          do {
            pdVar26 = pdVar20;
            pdVar26[-1] = (double)CONCAT44(uVar31,uVar30);
            *pdVar26 = pdVar26[-3];
            pdVar26[1] = pdVar26[-2];
            dVar32 = pdVar26[-7];
            uVar30 = SUB84(dVar32,0);
            uVar31 = (undefined4)((ulong)dVar32 >> 0x20);
            pdVar20 = pdVar26 + -3;
          } while (dVar32 < dVar4);
          pdVar26[-4] = dVar4;
          pdVar26[-3] = dVar5;
          pdVar26[-2] = dVar7;
        }
        pdVar20 = pdVar19 + 3;
        pdVar15 = pdVar15 + 3;
        begin = pdVar19;
      } while (pdVar20 != end);
      return;
    }
  }
  else {
    pdVar15 = end + -2;
    pdVar20 = end + -5;
    pdVar19 = end + -8;
    local_68 = param_3;
    do {
      uVar14 = uVar28 / 0x30;
      pdVar26 = begin + uVar14 * 3;
      if (uVar28 < 0xc01) {
        dVar4 = *begin;
        uVar30 = SUB84(dVar4,0);
        uVar31 = (undefined4)((ulong)dVar4 >> 0x20);
        dVar5 = *pdVar26;
        if (dVar5 < dVar4) {
          *pdVar26 = dVar4;
          *begin = dVar5;
          dVar4 = pdVar26[1];
          dVar5 = pdVar26[2];
          dVar7 = begin[2];
          pdVar26[1] = begin[1];
          pdVar26[2] = dVar7;
          begin[1] = dVar4;
          begin[2] = dVar5;
          uVar30 = SUB84(*begin,0);
          uVar31 = (undefined4)((ulong)*begin >> 0x20);
        }
        dVar4 = end[-3];
        if ((double)CONCAT44(uVar31,uVar30) <= dVar4 && dVar4 != (double)CONCAT44(uVar31,uVar30)) {
          *begin = dVar4;
          end[-3] = (double)CONCAT44(uVar31,uVar30);
          dVar4 = begin[1];
          dVar5 = begin[2];
          dVar7 = end[-1];
          begin[1] = *pdVar15;
          begin[2] = dVar7;
          *pdVar15 = dVar4;
          end[-1] = dVar5;
          uVar30 = SUB84(*begin,0);
          uVar31 = (undefined4)((ulong)*begin >> 0x20);
        }
        dVar4 = *pdVar26;
        if (dVar4 <= (double)CONCAT44(uVar31,uVar30) && (double)CONCAT44(uVar31,uVar30) != dVar4) {
          *pdVar26 = (double)CONCAT44(uVar31,uVar30);
          *begin = dVar4;
          dVar4 = pdVar26[1];
          dVar5 = pdVar26[2];
          dVar7 = begin[2];
          pdVar26[1] = begin[1];
          pdVar26[2] = dVar7;
          begin[1] = dVar4;
          begin[2] = dVar5;
        }
      }
      else {
        dVar4 = *pdVar26;
        uVar30 = SUB84(dVar4,0);
        uVar31 = (undefined4)((ulong)dVar4 >> 0x20);
        dVar5 = *begin;
        if (dVar5 < dVar4) {
          *begin = dVar4;
          *pdVar26 = dVar5;
          dVar4 = begin[1];
          dVar5 = begin[2];
          dVar7 = pdVar26[2];
          begin[1] = pdVar26[1];
          begin[2] = dVar7;
          pdVar26[1] = dVar4;
          pdVar26[2] = dVar5;
          uVar30 = SUB84(*pdVar26,0);
          uVar31 = (undefined4)((ulong)*pdVar26 >> 0x20);
        }
        dVar4 = end[-3];
        if ((double)CONCAT44(uVar31,uVar30) <= dVar4 && dVar4 != (double)CONCAT44(uVar31,uVar30)) {
          *pdVar26 = dVar4;
          end[-3] = (double)CONCAT44(uVar31,uVar30);
          dVar4 = pdVar26[1];
          dVar5 = pdVar26[2];
          dVar7 = end[-1];
          pdVar26[1] = *pdVar15;
          pdVar26[2] = dVar7;
          *pdVar15 = dVar4;
          end[-1] = dVar5;
          uVar30 = SUB84(*pdVar26,0);
          uVar31 = (undefined4)((ulong)*pdVar26 >> 0x20);
        }
        dVar4 = *begin;
        if (dVar4 <= (double)CONCAT44(uVar31,uVar30) && (double)CONCAT44(uVar31,uVar30) != dVar4) {
          *begin = (double)CONCAT44(uVar31,uVar30);
          *pdVar26 = dVar4;
          dVar4 = begin[1];
          dVar5 = begin[2];
          dVar7 = pdVar26[2];
          begin[1] = pdVar26[1];
          begin[2] = dVar7;
          pdVar26[1] = dVar4;
          pdVar26[2] = dVar5;
        }
        pdVar18 = begin + uVar14 * 3 + -3;
        dVar4 = *pdVar18;
        uVar30 = SUB84(dVar4,0);
        uVar31 = (undefined4)((ulong)dVar4 >> 0x20);
        dVar5 = begin[3];
        if (dVar5 < dVar4) {
          begin[3] = dVar4;
          *pdVar18 = dVar5;
          dVar4 = begin[4];
          dVar5 = begin[5];
          dVar7 = begin[uVar14 * 3 + -1];
          begin[4] = begin[uVar14 * 3 + -2];
          begin[5] = dVar7;
          begin[uVar14 * 3 + -2] = dVar4;
          begin[uVar14 * 3 + -1] = dVar5;
          uVar30 = SUB84(*pdVar18,0);
          uVar31 = (undefined4)((ulong)*pdVar18 >> 0x20);
        }
        dVar4 = end[-6];
        if ((double)CONCAT44(uVar31,uVar30) <= dVar4 && dVar4 != (double)CONCAT44(uVar31,uVar30)) {
          *pdVar18 = dVar4;
          end[-6] = (double)CONCAT44(uVar31,uVar30);
          dVar4 = begin[uVar14 * 3 + -2];
          dVar5 = begin[uVar14 * 3 + -1];
          dVar7 = end[-4];
          begin[uVar14 * 3 + -2] = *pdVar20;
          begin[uVar14 * 3 + -1] = dVar7;
          *pdVar20 = dVar4;
          end[-4] = dVar5;
          uVar30 = SUB84(*pdVar18,0);
          uVar31 = (undefined4)((ulong)*pdVar18 >> 0x20);
        }
        dVar4 = begin[3];
        if (dVar4 <= (double)CONCAT44(uVar31,uVar30) && (double)CONCAT44(uVar31,uVar30) != dVar4) {
          begin[3] = (double)CONCAT44(uVar31,uVar30);
          *pdVar18 = dVar4;
          dVar4 = begin[4];
          dVar5 = begin[5];
          dVar7 = begin[uVar14 * 3 + -1];
          begin[4] = begin[uVar14 * 3 + -2];
          begin[5] = dVar7;
          begin[uVar14 * 3 + -2] = dVar4;
          begin[uVar14 * 3 + -1] = dVar5;
        }
        pdVar23 = begin + uVar14 * 3 + 3;
        dVar4 = *pdVar23;
        uVar30 = SUB84(dVar4,0);
        uVar31 = (undefined4)((ulong)dVar4 >> 0x20);
        dVar5 = begin[6];
        if (dVar5 < dVar4) {
          begin[6] = dVar4;
          *pdVar23 = dVar5;
          dVar4 = begin[7];
          dVar5 = begin[8];
          dVar7 = begin[uVar14 * 3 + 5];
          begin[7] = begin[uVar14 * 3 + 4];
          begin[8] = dVar7;
          begin[uVar14 * 3 + 4] = dVar4;
          begin[uVar14 * 3 + 5] = dVar5;
          uVar30 = SUB84(*pdVar23,0);
          uVar31 = (undefined4)((ulong)*pdVar23 >> 0x20);
        }
        dVar4 = end[-9];
        if ((double)CONCAT44(uVar31,uVar30) <= dVar4 && dVar4 != (double)CONCAT44(uVar31,uVar30)) {
          *pdVar23 = dVar4;
          end[-9] = (double)CONCAT44(uVar31,uVar30);
          dVar4 = begin[uVar14 * 3 + 4];
          dVar5 = begin[uVar14 * 3 + 5];
          dVar7 = end[-7];
          begin[uVar14 * 3 + 4] = *pdVar19;
          begin[uVar14 * 3 + 5] = dVar7;
          *pdVar19 = dVar4;
          end[-7] = dVar5;
          uVar30 = SUB84(*pdVar23,0);
          uVar31 = (undefined4)((ulong)*pdVar23 >> 0x20);
        }
        dVar4 = begin[6];
        if (dVar4 <= (double)CONCAT44(uVar31,uVar30) && (double)CONCAT44(uVar31,uVar30) != dVar4) {
          begin[6] = (double)CONCAT44(uVar31,uVar30);
          *pdVar23 = dVar4;
          dVar4 = begin[7];
          dVar5 = begin[8];
          dVar7 = begin[uVar14 * 3 + 5];
          begin[7] = begin[uVar14 * 3 + 4];
          begin[8] = dVar7;
          begin[uVar14 * 3 + 4] = dVar4;
          begin[uVar14 * 3 + 5] = dVar5;
        }
        dVar4 = *pdVar26;
        uVar30 = SUB84(dVar4,0);
        uVar31 = (undefined4)((ulong)dVar4 >> 0x20);
        dVar5 = *pdVar18;
        if (dVar5 < dVar4) {
          *pdVar18 = dVar4;
          *pdVar26 = dVar5;
          dVar4 = begin[uVar14 * 3 + -2];
          dVar5 = begin[uVar14 * 3 + -1];
          dVar7 = pdVar26[2];
          begin[uVar14 * 3 + -2] = pdVar26[1];
          begin[uVar14 * 3 + -1] = dVar7;
          pdVar26[1] = dVar4;
          pdVar26[2] = dVar5;
          uVar30 = SUB84(*pdVar26,0);
          uVar31 = (undefined4)((ulong)*pdVar26 >> 0x20);
        }
        dVar4 = *pdVar23;
        if ((double)CONCAT44(uVar31,uVar30) <= dVar4 && dVar4 != (double)CONCAT44(uVar31,uVar30)) {
          *pdVar26 = dVar4;
          *pdVar23 = (double)CONCAT44(uVar31,uVar30);
          dVar4 = pdVar26[1];
          dVar5 = pdVar26[2];
          dVar7 = begin[uVar14 * 3 + 5];
          pdVar26[1] = begin[uVar14 * 3 + 4];
          pdVar26[2] = dVar7;
          begin[uVar14 * 3 + 4] = dVar4;
          begin[uVar14 * 3 + 5] = dVar5;
          uVar30 = SUB84(*pdVar26,0);
          uVar31 = (undefined4)((ulong)*pdVar26 >> 0x20);
        }
        dVar4 = *pdVar18;
        if (dVar4 <= (double)CONCAT44(uVar31,uVar30) && (double)CONCAT44(uVar31,uVar30) != dVar4) {
          *pdVar18 = (double)CONCAT44(uVar31,uVar30);
          *pdVar26 = dVar4;
          dVar4 = begin[uVar14 * 3 + -2];
          dVar5 = begin[uVar14 * 3 + -1];
          dVar7 = pdVar26[2];
          begin[uVar14 * 3 + -2] = pdVar26[1];
          begin[uVar14 * 3 + -1] = dVar7;
          pdVar26[1] = dVar4;
          pdVar26[2] = dVar5;
          uVar30 = SUB84(*pdVar26,0);
          uVar31 = (undefined4)((ulong)*pdVar26 >> 0x20);
        }
        dVar4 = *begin;
        *begin = (double)CONCAT44(uVar31,uVar30);
        *pdVar26 = dVar4;
        dVar4 = begin[1];
        dVar5 = begin[2];
        dVar7 = pdVar26[2];
        begin[1] = pdVar26[1];
        begin[2] = dVar7;
        pdVar26[1] = dVar4;
        pdVar26[2] = dVar5;
      }
      dVar4 = *begin;
      if (((param_4 & 1) != 0) || (dVar4 < begin[-3])) {
        uVar14 = uVar28 / 0x18;
        pdVar26 = begin + 1;
        dVar5 = begin[1];
        dVar7 = begin[2];
        lVar13 = 0;
        do {
          dVar32 = *(double *)((long)begin + lVar13 + 0x18);
          uVar30 = SUB84(dVar32,0);
          uVar31 = (undefined4)((ulong)dVar32 >> 0x20);
          lVar13 = lVar13 + 0x18;
        } while (dVar4 < dVar32);
        pdVar18 = (double *)((long)begin + lVar13);
        pdVar23 = end;
        if (lVar13 == 0x18) {
          do {
            if (pdVar23 <= pdVar18) break;
            pdVar16 = pdVar23 + -3;
            pdVar23 = pdVar23 + -3;
          } while (*pdVar16 <= dVar4);
        }
        else {
          do {
            pdVar16 = pdVar23 + -3;
            pdVar23 = pdVar23 + -3;
          } while (*pdVar16 <= dVar4);
        }
        if (pdVar18 < pdVar23) {
          dVar32 = *pdVar23;
          pdVar16 = pdVar23;
          do {
            *(double *)((long)begin + lVar13) = dVar32;
            *pdVar16 = (double)CONCAT44(uVar31,uVar30);
            pdVar22 = (double *)((long)begin + lVar13 + 8);
            dVar32 = *pdVar22;
            dVar8 = pdVar22[1];
            dVar9 = pdVar16[2];
            pdVar22 = (double *)((long)begin + lVar13 + 8);
            *pdVar22 = pdVar16[1];
            pdVar22[1] = dVar9;
            pdVar16[1] = dVar32;
            pdVar16[2] = dVar8;
            do {
              dVar32 = *(double *)((long)begin + lVar13 + 0x18);
              uVar30 = SUB84(dVar32,0);
              uVar31 = (undefined4)((ulong)dVar32 >> 0x20);
              lVar13 = lVar13 + 0x18;
            } while (dVar4 < dVar32);
            do {
              dVar32 = pdVar16[-3];
              pdVar16 = pdVar16 + -3;
            } while (dVar32 <= dVar4);
          } while ((double *)((long)begin + lVar13) < pdVar16);
        }
        pdVar16 = (double *)((long)begin + lVar13);
        pdVar22 = (double *)((long)begin + lVar13 + -0x18);
        *begin = *pdVar22;
        uVar30 = *(undefined4 *)((long)begin + lVar13 + -0xc);
        uVar31 = *(undefined4 *)((long)begin + lVar13 + -8);
        uVar6 = *(undefined4 *)((long)begin + lVar13 + -4);
        *(undefined4 *)pdVar26 = *(undefined4 *)((long)begin + lVar13 + -0x10);
        *(undefined4 *)((long)begin + 0xc) = uVar30;
        *(undefined4 *)(begin + 2) = uVar31;
        *(undefined4 *)((long)begin + 0x14) = uVar6;
        *pdVar22 = dVar4;
        local_48 = SUB84(dVar5,0);
        uStack_44 = (undefined4)((ulong)dVar5 >> 0x20);
        uStack_40 = SUB84(dVar7,0);
        uStack_3c = (undefined4)((ulong)dVar7 >> 0x20);
        *(undefined4 *)((long)begin + lVar13 + -0x10) = local_48;
        *(undefined4 *)((long)begin + lVar13 + -0xc) = uStack_44;
        *(undefined4 *)((long)begin + lVar13 + -8) = uStack_40;
        *(undefined4 *)((long)begin + lVar13 + -4) = uStack_3c;
        uVar24 = (lVar13 + -0x18 >> 3) * -0x5555555555555555;
        uVar28 = (long)end - (long)pdVar16;
        uVar17 = ((long)uVar28 >> 3) * -0x5555555555555555;
        if (((long)uVar24 < (long)(uVar14 >> 3)) || ((long)uVar17 < (long)(uVar14 >> 3))) {
          local_68 = local_68 + -1;
          if (local_68 == 0) {
            uVar28 = uVar14 - 2 >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,long,std::pair<double,HighsDomainChange>,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::rootReducedCost()::__0>>
                        (begin,uVar28,uVar14);
              bVar29 = uVar28 != 0;
              uVar28 = uVar28 - 1;
            } while (bVar29);
            pdVar15 = end + -3;
            lVar13 = (long)end - (long)begin;
            do {
              *pdVar15 = *begin;
              dVar4 = begin[2];
              pdVar15[1] = *pdVar26;
              pdVar15[2] = dVar4;
              lVar13 = lVar13 + -0x18;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,long,std::pair<double,HighsDomainChange>,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::rootReducedCost()::__0>>
                        (begin,0,(lVar13 >> 3) * -0x5555555555555555);
              pdVar15 = pdVar15 + -3;
            } while (0x18 < lVar13);
            return;
          }
          if (0x240 < lVar13) {
            uVar14 = uVar24 >> 2;
            dVar4 = *begin;
            *begin = begin[uVar14 * 3];
            begin[uVar14 * 3] = dVar4;
            dVar4 = *pdVar26;
            dVar5 = begin[2];
            dVar7 = (begin + uVar14 * 3 + 1)[1];
            *pdVar26 = begin[uVar14 * 3 + 1];
            begin[2] = dVar7;
            begin[uVar14 * 3 + 1] = dVar4;
            (begin + uVar14 * 3 + 1)[1] = dVar5;
            dVar4 = *(double *)((long)begin + lVar13 + -0x30);
            *(double *)((long)begin + lVar13 + -0x30) = pdVar22[uVar14 * -3];
            pdVar22[uVar14 * -3] = dVar4;
            uVar10 = *(undefined8 *)((long)begin + lVar13 + -0x28);
            uVar11 = *(undefined8 *)((long)begin + lVar13 + -0x20);
            puVar1 = (undefined8 *)((long)begin + uVar14 * -0x18 + lVar13 + -0x10);
            uVar12 = puVar1[1];
            *(undefined8 *)((long)begin + lVar13 + -0x28) = *puVar1;
            *(undefined8 *)((long)begin + lVar13 + -0x20) = uVar12;
            local_88 = (undefined4)uVar10;
            uStack_84 = (undefined4)((ulong)uVar10 >> 0x20);
            uStack_80 = (undefined4)uVar11;
            uStack_7c = (undefined4)((ulong)uVar11 >> 0x20);
            puVar2 = (undefined4 *)((long)begin + uVar14 * -0x18 + lVar13 + -0x10);
            *puVar2 = local_88;
            puVar2[1] = uStack_84;
            puVar2[2] = uStack_80;
            puVar2[3] = uStack_7c;
            if (0x80 < uVar24) {
              dVar4 = begin[3];
              begin[3] = begin[uVar14 * 3 + 3];
              begin[uVar14 * 3 + 3] = dVar4;
              dVar4 = begin[4];
              dVar5 = begin[5];
              dVar7 = (begin + uVar14 * 3 + 4)[1];
              begin[4] = begin[uVar14 * 3 + 4];
              begin[5] = dVar7;
              begin[uVar14 * 3 + 4] = dVar4;
              (begin + uVar14 * 3 + 4)[1] = dVar5;
              dVar4 = begin[6];
              begin[6] = begin[uVar14 * 3 + 6];
              begin[uVar14 * 3 + 6] = dVar4;
              dVar4 = begin[7];
              dVar5 = begin[8];
              dVar7 = (begin + uVar14 * 3 + 7)[1];
              begin[7] = begin[uVar14 * 3 + 7];
              begin[8] = dVar7;
              begin[uVar14 * 3 + 7] = dVar4;
              (begin + uVar14 * 3 + 7)[1] = dVar5;
              uVar24 = ~uVar14;
              dVar4 = *(double *)((long)begin + lVar13 + -0x48);
              *(double *)((long)begin + lVar13 + -0x48) = pdVar22[uVar24 * 3];
              pdVar22[uVar24 * 3] = dVar4;
              uVar10 = *(undefined8 *)((long)begin + lVar13 + -0x40);
              uVar11 = *(undefined8 *)((long)begin + lVar13 + -0x38);
              puVar1 = (undefined8 *)((long)begin + uVar24 * 0x18 + lVar13 + -0x10);
              uVar12 = puVar1[1];
              *(undefined8 *)((long)begin + lVar13 + -0x40) = *puVar1;
              *(undefined8 *)((long)begin + lVar13 + -0x38) = uVar12;
              puVar1 = (undefined8 *)((long)begin + uVar24 * 0x18 + lVar13 + -0x10);
              *puVar1 = uVar10;
              puVar1[1] = uVar11;
              lVar21 = -2 - uVar14;
              dVar4 = *(double *)((long)begin + lVar13 + -0x60);
              *(double *)((long)begin + lVar13 + -0x60) = pdVar22[lVar21 * 3];
              pdVar22[lVar21 * 3] = dVar4;
              uVar10 = *(undefined8 *)((long)begin + lVar13 + -0x58);
              uVar11 = *(undefined8 *)((long)begin + lVar13 + -0x50);
              puVar1 = (undefined8 *)((long)begin + lVar21 * 0x18 + lVar13 + -0x10);
              uVar12 = puVar1[1];
              *(undefined8 *)((long)begin + lVar13 + -0x58) = *puVar1;
              *(undefined8 *)((long)begin + lVar13 + -0x50) = uVar12;
              local_88 = (undefined4)uVar10;
              uStack_84 = (undefined4)((ulong)uVar10 >> 0x20);
              uStack_80 = (undefined4)uVar11;
              uStack_7c = (undefined4)((ulong)uVar11 >> 0x20);
              puVar2 = (undefined4 *)((long)begin + lVar21 * 0x18 + lVar13 + -0x10);
              *puVar2 = local_88;
              puVar2[1] = uStack_84;
              puVar2[2] = uStack_80;
              puVar2[3] = uStack_7c;
            }
          }
          if (0x228 < (long)uVar28) {
            uVar14 = uVar17 >> 2;
            dVar4 = *pdVar16;
            *pdVar16 = *(double *)((long)begin + uVar14 * 0x18 + lVar13);
            *(double *)((long)begin + uVar14 * 0x18 + lVar13) = dVar4;
            dVar4 = pdVar16[1];
            dVar5 = pdVar16[2];
            pdVar26 = (double *)((long)begin + uVar14 * 0x18 + lVar13 + 8);
            dVar7 = pdVar26[1];
            pdVar16[1] = *pdVar26;
            pdVar16[2] = dVar7;
            pdVar26 = (double *)((long)begin + uVar14 * 0x18 + lVar13 + 8);
            *pdVar26 = dVar4;
            pdVar26[1] = dVar5;
            dVar4 = end[-3];
            end[-3] = end[uVar14 * -3];
            end[uVar14 * -3] = dVar4;
            dVar4 = *pdVar15;
            dVar5 = end[-1];
            dVar7 = (end + uVar14 * -3 + 1)[1];
            *pdVar15 = end[uVar14 * -3 + 1];
            end[-1] = dVar7;
            local_88 = SUB84(dVar4,0);
            uStack_84 = (undefined4)((ulong)dVar4 >> 0x20);
            uStack_80 = SUB84(dVar5,0);
            uStack_7c = (undefined4)((ulong)dVar5 >> 0x20);
            pdVar26 = end + uVar14 * -3 + 1;
            *(undefined4 *)pdVar26 = local_88;
            *(undefined4 *)((long)pdVar26 + 4) = uStack_84;
            *(undefined4 *)(pdVar26 + 1) = uStack_80;
            *(undefined4 *)((long)pdVar26 + 0xc) = uStack_7c;
            if (0x80 < uVar17) {
              dVar4 = *(double *)((long)begin + lVar13 + 0x18);
              *(double *)((long)begin + lVar13 + 0x18) = pdVar22[uVar14 * 3 + 6];
              pdVar22[uVar14 * 3 + 6] = dVar4;
              dVar4 = *(double *)((long)begin + lVar13 + 0x20);
              dVar5 = *(double *)((long)begin + lVar13 + 0x28);
              dVar7 = pdVar22[uVar14 * 3 + 8];
              *(double *)((long)begin + lVar13 + 0x20) = pdVar22[uVar14 * 3 + 7];
              *(double *)((long)begin + lVar13 + 0x28) = dVar7;
              pdVar22[uVar14 * 3 + 7] = dVar4;
              pdVar22[uVar14 * 3 + 8] = dVar5;
              dVar4 = *(double *)((long)begin + lVar13 + 0x30);
              *(double *)((long)begin + lVar13 + 0x30) = pdVar22[uVar14 * 3 + 9];
              pdVar22[uVar14 * 3 + 9] = dVar4;
              dVar4 = *(double *)((long)begin + lVar13 + 0x38);
              dVar5 = *(double *)((long)begin + lVar13 + 0x40);
              dVar7 = pdVar22[uVar14 * 3 + 0xb];
              *(double *)((long)begin + lVar13 + 0x38) = pdVar22[uVar14 * 3 + 10];
              *(double *)((long)begin + lVar13 + 0x40) = dVar7;
              pdVar22[uVar14 * 3 + 10] = dVar4;
              pdVar22[uVar14 * 3 + 0xb] = dVar5;
              uVar17 = ~uVar14;
              dVar4 = end[-6];
              end[-6] = end[uVar17 * 3];
              end[uVar17 * 3] = dVar4;
              dVar4 = *pdVar20;
              dVar5 = end[-4];
              dVar7 = (end + uVar17 * 3 + 1)[1];
              *pdVar20 = end[uVar17 * 3 + 1];
              end[-4] = dVar7;
              end[uVar17 * 3 + 1] = dVar4;
              (end + uVar17 * 3 + 1)[1] = dVar5;
              lVar13 = -2 - uVar14;
              dVar4 = end[-9];
              end[-9] = end[lVar13 * 3];
              end[lVar13 * 3] = dVar4;
              dVar4 = *pdVar19;
              dVar5 = end[-7];
              dVar7 = (end + lVar13 * 3 + 1)[1];
              *pdVar19 = end[lVar13 * 3 + 1];
              end[-7] = dVar7;
              local_88 = SUB84(dVar4,0);
              uStack_84 = (undefined4)((ulong)dVar4 >> 0x20);
              uStack_80 = SUB84(dVar5,0);
              uStack_7c = (undefined4)((ulong)dVar5 >> 0x20);
              pdVar26 = end + lVar13 * 3 + 1;
              *(undefined4 *)pdVar26 = local_88;
              *(undefined4 *)((long)pdVar26 + 4) = uStack_84;
              *(undefined4 *)(pdVar26 + 1) = uStack_80;
              *(undefined4 *)((long)pdVar26 + 0xc) = uStack_7c;
            }
          }
        }
        else if (pdVar23 <= pdVar18) {
          if ((lVar13 != 0x18) && (lVar13 != 0x30)) {
            lVar21 = 0;
            uVar14 = 0;
            pdVar26 = begin + 3;
            pdVar18 = begin;
            do {
              pdVar23 = pdVar26;
              dVar4 = pdVar18[3];
              if (*pdVar18 <= dVar4 && dVar4 != *pdVar18) {
                dVar5 = pdVar18[4];
                dVar7 = pdVar18[5];
                uVar30 = SUB84(*pdVar18,0);
                uVar31 = (undefined4)((ulong)*pdVar18 >> 0x20);
                lVar25 = lVar21;
                pdVar26 = pdVar23;
                do {
                  pdVar18 = pdVar26;
                  *pdVar18 = (double)CONCAT44(uVar31,uVar30);
                  *(undefined4 *)(pdVar18 + 1) = *(undefined4 *)(pdVar18 + -2);
                  *(undefined4 *)((long)pdVar18 + 0xc) = *(undefined4 *)((long)pdVar18 + -0xc);
                  *(undefined4 *)(pdVar18 + 2) = *(undefined4 *)(pdVar18 + -1);
                  *(undefined4 *)((long)pdVar18 + 0x14) = *(undefined4 *)((long)pdVar18 + -4);
                  pdVar26 = begin;
                  if (lVar25 == 0) break;
                  pdVar26 = pdVar18 + -3;
                  dVar32 = pdVar18[-6];
                  uVar30 = SUB84(dVar32,0);
                  uVar31 = (undefined4)((ulong)dVar32 >> 0x20);
                  lVar25 = lVar25 + 0x18;
                } while (dVar32 < dVar4);
                *pdVar26 = dVar4;
                local_88 = SUB84(dVar5,0);
                uStack_84 = (undefined4)((ulong)dVar5 >> 0x20);
                uStack_80 = SUB84(dVar7,0);
                uStack_7c = (undefined4)((ulong)dVar7 >> 0x20);
                *(undefined4 *)(pdVar18 + -2) = local_88;
                *(undefined4 *)((long)pdVar18 + -0xc) = uStack_84;
                *(undefined4 *)(pdVar18 + -1) = uStack_80;
                *(undefined4 *)((long)pdVar18 + -4) = uStack_7c;
                uVar14 = uVar14 + ((long)pdVar23 - (long)pdVar26 >> 3) * -0x5555555555555555;
                if (8 < uVar14) goto LAB_002d7a65;
              }
              lVar21 = lVar21 + -0x18;
              pdVar26 = pdVar23 + 3;
              pdVar18 = pdVar23;
            } while (pdVar23 + 3 != pdVar22);
          }
          if (pdVar16 == end) {
            return;
          }
          if (pdVar16 + 3 == end) {
            return;
          }
          lVar21 = 0;
          uVar14 = 0;
          pdVar26 = pdVar16 + 3;
          pdVar18 = pdVar16;
          do {
            pdVar23 = pdVar26;
            dVar4 = pdVar18[3];
            if (*pdVar18 <= dVar4 && dVar4 != *pdVar18) {
              dVar5 = pdVar18[4];
              dVar7 = pdVar18[5];
              uVar30 = SUB84(*pdVar18,0);
              uVar31 = (undefined4)((ulong)*pdVar18 >> 0x20);
              lVar25 = lVar21;
              do {
                lVar27 = lVar25;
                *(ulong *)((long)pdVar16 + lVar27 + 0x18) = CONCAT44(uVar31,uVar30);
                puVar2 = (undefined4 *)((long)pdVar16 + lVar27 + 8);
                uVar30 = puVar2[1];
                uVar31 = puVar2[2];
                uVar6 = puVar2[3];
                puVar3 = (undefined4 *)((long)pdVar16 + lVar27 + 0x20);
                *puVar3 = *puVar2;
                puVar3[1] = uVar30;
                puVar3[2] = uVar31;
                puVar3[3] = uVar6;
                pdVar26 = pdVar16;
                pdVar18 = pdVar16;
                if (lVar27 == 0) goto LAB_002d7c18;
                dVar32 = *(double *)((long)pdVar16 + lVar27 + -0x18);
                uVar30 = SUB84(dVar32,0);
                uVar31 = (undefined4)((ulong)dVar32 >> 0x20);
                lVar25 = lVar27 + -0x18;
              } while (dVar32 < dVar4);
              pdVar26 = (double *)((long)begin + lVar27 + -0x18 + lVar13 + 0x18);
              pdVar18 = (double *)((long)pdVar16 + lVar27);
LAB_002d7c18:
              *pdVar18 = dVar4;
              local_88 = SUB84(dVar5,0);
              uStack_84 = (undefined4)((ulong)dVar5 >> 0x20);
              uStack_80 = SUB84(dVar7,0);
              uStack_7c = (undefined4)((ulong)dVar7 >> 0x20);
              puVar2 = (undefined4 *)((long)pdVar16 + lVar27 + 8);
              *puVar2 = local_88;
              puVar2[1] = uStack_84;
              puVar2[2] = uStack_80;
              puVar2[3] = uStack_7c;
              uVar14 = uVar14 + ((long)pdVar23 - (long)pdVar26 >> 3) * -0x5555555555555555;
              if (8 < uVar14) break;
            }
            lVar21 = lVar21 + 0x18;
            pdVar26 = pdVar23 + 3;
            pdVar18 = pdVar23;
            if (pdVar23 + 3 == end) {
              return;
            }
          } while( true );
        }
LAB_002d7a65:
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,HighsDomainChange>*,std::vector<std::pair<double,HighsDomainChange>,std::allocator<std::pair<double,HighsDomainChange>>>>,HighsPrimalHeuristics::rootReducedCost()::__0,false>
                  (begin,pdVar22,local_68);
        param_4 = 0;
        begin = pdVar16;
      }
      else {
        dVar5 = begin[1];
        dVar7 = begin[2];
        lVar13 = 0;
        do {
          dVar32 = *(double *)((long)end + lVar13 + -0x18);
          uVar30 = SUB84(dVar32,0);
          uVar31 = (undefined4)((ulong)dVar32 >> 0x20);
          lVar13 = lVar13 + -0x18;
        } while (dVar32 < dVar4);
        pdVar26 = (double *)((long)end + lVar13);
        pdVar18 = begin;
        dVar32 = dVar4;
        if (lVar13 == -0x18) {
          do {
            if (pdVar26 <= pdVar18) break;
            pdVar18 = pdVar18 + 3;
            dVar32 = *pdVar18;
          } while (dVar4 <= dVar32);
        }
        else {
          do {
            dVar32 = pdVar18[3];
            pdVar18 = pdVar18 + 3;
          } while (dVar4 <= dVar32);
        }
        while (pdVar18 < pdVar26) {
          *pdVar18 = (double)CONCAT44(uVar31,uVar30);
          *pdVar26 = dVar32;
          dVar32 = pdVar18[1];
          dVar8 = pdVar18[2];
          dVar9 = pdVar26[2];
          pdVar18[1] = pdVar26[1];
          pdVar18[2] = dVar9;
          pdVar26[1] = dVar32;
          pdVar26[2] = dVar8;
          do {
            dVar32 = pdVar26[-3];
            uVar30 = SUB84(dVar32,0);
            uVar31 = (undefined4)((ulong)dVar32 >> 0x20);
            pdVar26 = pdVar26 + -3;
          } while (dVar32 < dVar4);
          do {
            dVar32 = pdVar18[3];
            pdVar18 = pdVar18 + 3;
          } while (dVar4 <= dVar32);
        }
        *begin = (double)CONCAT44(uVar31,uVar30);
        dVar32 = pdVar26[2];
        begin[1] = pdVar26[1];
        begin[2] = dVar32;
        *pdVar26 = dVar4;
        pdVar26[1] = dVar5;
        pdVar26[2] = dVar7;
        begin = pdVar26 + 3;
        uVar28 = (long)end - (long)begin;
      }
    } while (0x23f < (long)uVar28);
    if ((param_4 & 1) == 0) goto LAB_002d7d19;
  }
  if (begin + 3 != end && begin != end) {
    lVar13 = 0;
    pdVar15 = begin + 3;
    pdVar20 = begin;
    do {
      pdVar19 = pdVar15;
      dVar4 = pdVar20[3];
      if (*pdVar20 <= dVar4 && dVar4 != *pdVar20) {
        dVar5 = pdVar20[4];
        dVar7 = pdVar20[5];
        uVar30 = SUB84(*pdVar20,0);
        uVar31 = (undefined4)((ulong)*pdVar20 >> 0x20);
        lVar21 = lVar13;
        pdVar15 = pdVar19;
        do {
          pdVar20 = pdVar15;
          *pdVar20 = (double)CONCAT44(uVar31,uVar30);
          pdVar20[1] = pdVar20[-2];
          pdVar20[2] = pdVar20[-1];
          pdVar15 = begin;
          if (lVar21 == 0) break;
          pdVar15 = pdVar20 + -3;
          dVar32 = pdVar20[-6];
          uVar30 = SUB84(dVar32,0);
          uVar31 = (undefined4)((ulong)dVar32 >> 0x20);
          lVar21 = lVar21 + 0x18;
        } while (dVar32 < dVar4);
        *pdVar15 = dVar4;
        pdVar20[-2] = dVar5;
        pdVar20[-1] = dVar7;
      }
      lVar13 = lVar13 + -0x18;
      pdVar15 = pdVar19 + 3;
      pdVar20 = pdVar19;
    } while (pdVar19 + 3 != end);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }